

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

void __thiscall relive::ReLiveDB::~ReLiveDB(ReLiveDB *this)

{
  _Manager_type p_Var1;
  
  ghc::net::uri::~uri(&this->_master);
  std::__cxx11::
  _List_base<pearce::ThreadPool::TaskFuture<void>,_std::allocator<pearce::ThreadPool::TaskFuture<void>_>_>
  ::_M_clear(&(this->_jobs).
              super__List_base<pearce::ThreadPool::TaskFuture<void>,_std::allocator<pearce::ThreadPool::TaskFuture<void>_>_>
            );
  p_Var1 = (this->_progressHandler).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->_progressHandler,(_Any_data *)&this->_progressHandler,
              __destroy_functor);
  }
  pearce::ThreadPool::~ThreadPool(&this->_worker);
  return;
}

Assistant:

ReLiveDB::~ReLiveDB() {}